

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_replacedir(char *output,char *src,char *dir)

{
  char buffer [4096];
  char acStack_1018 [4104];
  
  stb__splitpath_raw(acStack_1018,src,6);
  if (dir == (char *)0x0) {
    strcpy(output,acStack_1018);
  }
  else {
    sprintf(output,"%s/%s",dir,acStack_1018);
  }
  return output;
}

Assistant:

char *stb_replacedir(char *output, char *src, char *dir)
{
   char buffer[4096];
   stb_splitpath(buffer, src, STB_FILE | STB_EXT);
   if (dir)
      sprintf(output, "%s/%s", dir, buffer);
   else
      strcpy(output, buffer);
   return output;
}